

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O2

void __thiscall txvalidationcache_tests::checkinputs_test::test_method(checkinputs_test *this)

{
  CKey *this_00;
  long lVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pCVar5;
  bool bVar6;
  CScript *pCVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  Chainstate *pCVar9;
  CCoinsViewCache *pCVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  iterator in_R8;
  iterator pvVar14;
  ValidationCache *pVVar15;
  iterator in_R9;
  iterator pvVar16;
  PrecomputedTransactionData *amount;
  uint256 *puVar17;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b_00;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<CMutableTransaction> __l;
  const_string file_05;
  const_string file_06;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_07;
  span<const_std::byte,_18446744073709551615UL> b_04;
  span<const_std::byte,_18446744073709551615UL> b_05;
  const_string file_08;
  const_string file_09;
  span<const_std::byte,_18446744073709551615UL> b_06;
  span<const_std::byte,_18446744073709551615UL> b_07;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  check_type cVar18;
  check_type cVar19;
  CMutableTransaction *assertion_descr;
  ValidationCache *validation_cache;
  uint local_b84;
  char *local_b80;
  char *local_b78;
  undefined1 *local_b70;
  undefined1 *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  assertion_result local_a70;
  undefined1 *local_a58;
  undefined1 *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig_2;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  CMutableTransaction spend_tx;
  char *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  char *local_7e8;
  char *local_7e0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  shared_count local_7c8;
  char **local_7c0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  uint256 hash;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_758 [5];
  _Rb_tree_node_base local_6e0;
  ListNode *local_6c0;
  vector<CTxOut,_std::allocator<CTxOut>_> local_6a0 [4];
  undefined1 local_640 [56];
  _Base_ptr local_608;
  _Base_ptr local_600;
  _Base_ptr local_5f8;
  __node_base_ptr local_5f0;
  ListNode *pLStack_5e8;
  ListNode *local_5e0;
  ListNode *pLStack_5d8;
  _Rb_tree_node_base local_5c8;
  ListNode *local_5a8;
  _Rb_tree_node_base local_598;
  size_t local_578;
  _Rb_tree_node_base local_568;
  size_t local_548;
  pointer pCStack_540;
  pointer local_538;
  pointer pCStack_530;
  pointer local_528;
  pointer pCStack_520;
  pointer local_518;
  uchar auStack_510 [64];
  _Rb_tree_node_base local_4d0;
  size_t local_4b0;
  _Rb_tree_node_base local_4a0;
  size_t local_480;
  _Rb_tree_node_base local_470;
  size_t local_450;
  _Rb_tree_node_base local_440;
  size_t local_420;
  CMutableTransaction invalid_with_cltv_tx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks;
  vector<CTxOut,_std::allocator<CTxOut>_> local_3b0;
  uint32_t local_398;
  uint256 hash_2;
  CBlock block;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [4];
  PrecomputedTransactionData ptd_spend_tx;
  FillableSigningProvider keystore;
  CScript p2wpkh_scriptPubKey;
  CScript p2pkh_scriptPubKey;
  CScript p2sh_scriptPubKey;
  CScript p2pk_scriptPubKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  this_00 = &(this->super_Dersig100Setup).super_TestChain100Setup.coinbaseKey;
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&keystore,(CPubKey *)&hash);
  b._M_extent._M_extent_value =
       keystore.mapKeys._M_t._M_impl._0_8_ -
       (long)keystore.super_SigningProvider._vptr_SigningProvider;
  b._M_ptr = (pointer)keystore.super_SigningProvider._vptr_SigningProvider;
  pCVar7 = CScript::operator<<((CScript *)&ptd_spend_tx,b);
  ppVar8 = &CScript::operator<<(pCVar7,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&p2pk_scriptPubKey.super_CScriptBase,ppVar8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&keystore);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx);
  ScriptHash::ScriptHash((ScriptHash *)&ptd_spend_tx,&p2pk_scriptPubKey);
  uVar11 = ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  hash.super_base_blob<256U>.m_data._M_elems[0] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0];
  hash.super_base_blob<256U>.m_data._M_elems[1] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1];
  hash.super_base_blob<256U>.m_data._M_elems[2] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2];
  hash.super_base_blob<256U>.m_data._M_elems[3] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3];
  hash.super_base_blob<256U>.m_data._M_elems[4] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4];
  hash.super_base_blob<256U>.m_data._M_elems[5] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5];
  hash.super_base_blob<256U>.m_data._M_elems[6] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6];
  hash.super_base_blob<256U>.m_data._M_elems[7] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7];
  hash.super_base_blob<256U>.m_data._M_elems[8] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8];
  hash.super_base_blob<256U>.m_data._M_elems[9] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9];
  hash.super_base_blob<256U>.m_data._M_elems[10] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10];
  hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar11;
  GetScriptForDestination(&p2sh_scriptPubKey,(CTxDestination *)&hash);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&hash);
  CKey::GetPubKey((CPubKey *)&ptd_spend_tx,this_00);
  PKHash::PKHash((PKHash *)&keystore,(CPubKey *)&ptd_spend_tx);
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       keystore.super_SigningProvider._vptr_SigningProvider;
  hash.super_base_blob<256U>.m_data._M_elems[8] = keystore.mapKeys._M_t._M_impl._0_1_;
  hash.super_base_blob<256U>.m_data._M_elems[9] = keystore.mapKeys._M_t._M_impl._1_1_;
  hash.super_base_blob<256U>.m_data._M_elems[10] = keystore.mapKeys._M_t._M_impl._2_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = keystore.mapKeys._M_t._M_impl._3_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = keystore.mapKeys._M_t._M_impl._4_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = keystore.mapKeys._M_t._M_impl._5_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = keystore.mapKeys._M_t._M_impl._6_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = keystore.mapKeys._M_t._M_impl._7_1_;
  GetScriptForDestination(&p2pkh_scriptPubKey,(CTxDestination *)&hash);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&hash);
  CKey::GetPubKey((CPubKey *)&ptd_spend_tx,this_00);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&keystore,(CPubKey *)&ptd_spend_tx);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       (undefined1)keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color._2_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color._3_1_;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       keystore.super_SigningProvider._vptr_SigningProvider;
  hash.super_base_blob<256U>.m_data._M_elems[8] = keystore.mapKeys._M_t._M_impl._0_1_;
  hash.super_base_blob<256U>.m_data._M_elems[9] = keystore.mapKeys._M_t._M_impl._1_1_;
  hash.super_base_blob<256U>.m_data._M_elems[10] = keystore.mapKeys._M_t._M_impl._2_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = keystore.mapKeys._M_t._M_impl._3_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = keystore.mapKeys._M_t._M_impl._4_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = keystore.mapKeys._M_t._M_impl._5_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = keystore.mapKeys._M_t._M_impl._6_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = keystore.mapKeys._M_t._M_impl._7_1_;
  GetScriptForDestination(&p2wpkh_scriptPubKey,(CTxDestination *)&hash);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&hash);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  local_7e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_7e0 = "";
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xb1;
  file.m_begin = (iterator)&local_7e8;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7f8,msg);
  bVar6 = FillableSigningProvider::AddKey(&keystore,this_00);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "keystore.AddKey(coinbaseKey)";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_808 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_800 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &vchSig;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar18,
             (size_t)&local_808,0xb1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_810 = "";
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar16;
  msg_00.m_begin = pvVar14;
  file_00.m_end = (iterator)0xb2;
  file_00.m_begin = (iterator)&local_818;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_828,
             msg_00);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] =
       FillableSigningProvider::AddCScript(&keystore,&p2pk_scriptPubKey);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "keystore.AddCScript(p2pk_scriptPubKey)";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_838 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_830 = "";
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &vchSig;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar18,
             (size_t)&local_838,0xb2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  CMutableTransaction::CMutableTransaction(&spend_tx);
  spend_tx.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&spend_tx.vin,1);
  peVar2 = (((this->super_Dersig100Setup).super_TestChain100Setup.m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar11 = *(undefined8 *)&(peVar2->hash).m_wrapped;
  uVar3 = *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4;
  *(undefined8 *)
   ((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar11;
  *(undefined8 *)
   (((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar3;
  ((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&spend_tx.vout,4);
  (spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start)->nValue = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &p2sh_scriptPubKey.super_CScriptBase);
  spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &p2wpkh_scriptPubKey.super_CScriptBase);
  spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[2].nValue = 11000000;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pCVar7 = CScript::operator<<((CScript *)&ptd_spend_tx,OP_CHECKLOCKTIMEVERIFY);
  pCVar7 = CScript::operator<<(pCVar7,OP_DROP);
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>(&vchSig,(CPubKey *)&hash);
  b_00._M_extent._M_extent_value =
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_00._M_ptr = vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pCVar7 = CScript::operator<<(pCVar7,b_00);
  ppVar8 = &CScript::operator<<(pCVar7,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,ppVar8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx);
  spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[3].nValue = 11000000;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pCVar7 = CScript::operator<<((CScript *)&ptd_spend_tx,OP_CHECKSEQUENCEVERIFY);
  pCVar7 = CScript::operator<<(pCVar7,OP_DROP);
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>(&vchSig,(CPubKey *)&hash);
  b_01._M_extent._M_extent_value =
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_01._M_ptr = vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pCVar7 = CScript::operator<<(pCVar7,b_01);
  ppVar8 = &CScript::operator<<(pCVar7,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase,ppVar8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  _cVar19 = CHECK_PRED;
  pvVar14 = &DAT_00000001;
  amount = &ptd_spend_tx;
  SignatureHash<CMutableTransaction>
            (&hash,&p2pk_scriptPubKey,&spend_tx,0,1,(CAmount *)amount,BASE,
             (PrecomputedTransactionData *)0x0);
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)amount;
  msg_01.m_begin = pvVar14;
  file_01.m_end = (iterator)0xcc;
  file_01.m_begin = (iterator)&local_880;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_890,
             msg_01);
  bVar6 = CKey::Sign(this_00,&hash,&vchSig,true,0);
  block.super_CBlockHeader.nVersion._0_1_ = bVar6;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       &invalid_with_cltv_tx;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_13604ee;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_13604ee + 0x1e);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
       0xffffffffffffff00;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       &PTR__lazy_ostream_0113a070;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_898 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&block,(lazy_ostream *)&ptd_spend_tx,1,0,WARN,_cVar19,
             (size_t)&local_8a0,0xcc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ &
       0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vchSig,(uchar *)&ptd_spend_tx);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vchSig,(uchar *)&ptd_spend_tx);
  b_02._M_extent._M_extent_value =
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_02._M_ptr = vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  CScript::operator<<(&(spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,b_02);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  pvVar14 = (iterator)0xd6;
  pvVar16 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
             ,0xd6,false);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x14;
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._4_8_ =
       block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  memset(&ptd_spend_tx,0,0x102);
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  ptd_spend_tx._281_8_ = 0;
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar16;
  msg_02.m_begin = pvVar14;
  file_02.m_end = (iterator)0xdb;
  file_02.m_begin = (iterator)&local_8b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_8c0,
             msg_02);
  CTransaction::CTransaction((CTransaction *)&vchSig,&spend_tx);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar10,false);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  bVar6 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&block,
                            (CCoinsViewCache *)&hash,5,true,true,&ptd_spend_tx,pVVar15,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(scriptchecks.
                         super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,!bVar6);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&hash_2;
  hash_2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_13605fb;
  hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "!CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, nullptr)"
       + 0xd5;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8c8 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptchecks,(lazy_ostream *)&invalid_with_cltv_tx,1,0,WARN,
             (check_type)pVVar15,(size_t)&local_8d0,0xdb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&hash);
  CTransaction::~CTransaction((CTransaction *)&vchSig);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar16;
  msg_03.m_begin = pvVar14;
  file_03.m_end = (iterator)0xe1;
  file_03.m_begin = (iterator)&local_8e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8f0,
             msg_03);
  CTransaction::CTransaction((CTransaction *)&vchSig,&spend_tx);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar10,false);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  bVar6 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&block,
                            (CCoinsViewCache *)&hash,5,true,true,&ptd_spend_tx,pVVar15,&scriptchecks
                           );
  hash_2.super_base_blob<256U>.m_data._M_elems[0] = bVar6;
  hash_2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&vchSig_2;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, &scriptchecks)"
  ;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  assertion_descr = &invalid_with_cltv_tx;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8f8 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_2,(lazy_ostream *)assertion_descr,1,0,WARN,
             (check_type)pVVar15,(size_t)&local_900,0xe1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_2.super_base_blob<256U>.m_data._M_elems + 0x10));
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&hash);
  CTransaction::~CTransaction((CTransaction *)&vchSig);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar16;
  msg_04.m_begin = pvVar14;
  file_04.m_end = (iterator)0xe2;
  file_04.m_begin = (iterator)&local_910;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_920,
             msg_04);
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_928 = "";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x50);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&hash,&local_930,0xe2,1,2,&vchSig,"scriptchecks.size()",assertion_descr,"1U");
  CTransaction::CTransaction((CTransaction *)&hash,&spend_tx);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  ValidateCheckInputsForAllFlags
            ((CTransaction *)&hash,0xe,false,pCVar10,
             &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache);
  CTransaction::~CTransaction((CTransaction *)&hash);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&scriptchecks);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ptd_spend_tx.m_spent_outputs);
  ValidationState<TxValidationResult>::~ValidationState
            ((ValidationState<TxValidationResult> *)&block);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  CBlock::CBlock(&block);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&ptd_spend_tx,&spend_tx);
  __l._M_len = 1;
  __l._M_array = (iterator)&ptd_spend_tx;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&vchSig,__l,
             (allocator_type *)&invalid_with_cltv_tx);
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&hash,(TestChain100Setup *)this,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&vchSig,
             &p2pk_scriptPubKey,(Chainstate *)0x0);
  CBlock::operator=(&block,(CBlock *)&hash);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(local_758);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)&vchSig);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&ptd_spend_tx);
  pvVar14 = (iterator)0xf0;
  pvVar16 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock20,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
             ,0xf0,false);
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar16;
  msg_05.m_begin = pvVar14;
  file_05.m_end = (iterator)0xf1;
  file_05.m_begin = (iterator)&local_940;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_950,
             msg_05);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&hash,(pCVar9->m_chain).vChain.
                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1]);
  CBlockHeader::GetHash(&ptd_spend_tx.m_prevouts_single_hash,&block.super_CBlockHeader);
  bVar6 = ::operator==(&hash.super_base_blob<256U>,(base_blob<256U> *)&ptd_spend_tx);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_13605b3;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xc66a80;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_958 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  local_2e0._M_allocated_capacity = (size_type)(pointer)&scriptchecks;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_with_cltv_tx,(lazy_ostream *)&vchSig,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_960,0xf1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar16;
  msg_06.m_begin = pvVar14;
  file_06.m_end = (iterator)0xf2;
  file_06.m_begin = (iterator)&local_970;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_980,
             msg_06);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  (*(pCVar10->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&hash,pCVar10);
  CBlockHeader::GetHash(&ptd_spend_tx.m_prevouts_single_hash,&block.super_CBlockHeader);
  bVar6 = ::operator==(&hash.super_base_blob<256U>,(base_blob<256U> *)&ptd_spend_tx);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1360646;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_1360646 + 0x50);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "<W\x1b";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_988 = "";
  local_2e0._M_allocated_capacity = (size_type)(pointer)&scriptchecks;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&invalid_with_cltv_tx,(lazy_ostream *)&vchSig,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_990,0xf2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&ptd_spend_tx);
  ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\x01';
  ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx,1);
  CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
  *(undefined8 *)
   (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x10) =
       hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x18) =
       hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ + 8) =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined4 *)
   (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x20) = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18),1);
  uVar11 = ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(uVar11 + 8),
             &p2pk_scriptPubKey.super_CScriptBase);
  uVar11 = &p2pk_scriptPubKey.super_CScriptBase;
  if (0x1c < p2pk_scriptPubKey.super_CScriptBase._size) {
    uVar11 = p2pk_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
    p2pk_scriptPubKey.super_CScriptBase._size = p2pk_scriptPubKey.super_CScriptBase._size - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchSig,(iterator)uVar11,
             (uchar *)(uVar11 + (long)(int)p2pk_scriptPubKey.super_CScriptBase._size),
             (allocator_type *)&hash);
  b_03._M_extent._M_extent_value =
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_03._M_ptr = vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  CScript::operator<<((CScript *)
                      (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems.
                       _0_8_ + 0x28),b_03);
  CTransaction::CTransaction((CTransaction *)&hash,(CMutableTransaction *)&ptd_spend_tx);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  ValidateCheckInputsForAllFlags
            ((CTransaction *)&hash,1,true,pCVar10,
             &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache);
  CTransaction::~CTransaction((CTransaction *)&hash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&ptd_spend_tx);
  CMutableTransaction::CMutableTransaction(&invalid_with_cltv_tx);
  invalid_with_cltv_tx.version = 1;
  invalid_with_cltv_tx.nLockTime = 100;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&invalid_with_cltv_tx.vin,1);
  CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
  *(undefined8 *)
   (((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
   _M_elems = hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
    _M_elems + 8) = hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  ((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start)->prevout).n = 2;
  (invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
   super__Vector_impl_data._M_start)->nSequence = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&invalid_with_cltv_tx.vout,1);
  pCVar5 = invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  (invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar5->scriptPubKey).super_CScriptBase,&p2pk_scriptPubKey.super_CScriptBase);
  local_7c8.pi_ = (sp_counted_base *)0x0;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)0x0;
  criticalblock19.super_unique_lock._M_owns = false;
  criticalblock19.super_unique_lock._9_7_ = 0;
  puVar17 = &hash;
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  _cVar19 = CHECK_PRED;
  pvVar14 = &DAT_00000001;
  SignatureHash<CMutableTransaction>
            ((uint256 *)&scriptchecks,
             &spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey,&invalid_with_cltv_tx,0,1,
             (CAmount *)puVar17,BASE,(PrecomputedTransactionData *)0x0);
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)puVar17;
  msg_07.m_begin = pvVar14;
  file_07.m_end = (iterator)0x115;
  file_07.m_begin = (iterator)&local_9a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_9b0,
             msg_07);
  bVar6 = CKey::Sign(this_00,(uint256 *)&scriptchecks,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock19,true,
                     0);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_13604ee;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_13604ee + 0x1e);
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_9b8 = "";
  pvVar14 = (iterator)0x0;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       &vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = bVar6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar19,
             (size_t)&local_9c0,0x115);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock19,
             (uchar *)&hash);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  b_04._M_extent._M_extent_value =
       criticalblock19.super_unique_lock._8_8_ - (long)criticalblock19.super_unique_lock._M_device;
  b_04._M_ptr = (pointer)criticalblock19.super_unique_lock._M_device;
  pCVar7 = CScript::operator<<((CScript *)&hash,b_04);
  ppVar8 = &CScript::push_int64(pCVar7,0x65)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hash);
  CTransaction::CTransaction((CTransaction *)&hash,&invalid_with_cltv_tx);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  ValidateCheckInputsForAllFlags((CTransaction *)&hash,0x200,true,pCVar10,pVVar15);
  CTransaction::~CTransaction((CTransaction *)&hash);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  b_05._M_extent._M_extent_value =
       criticalblock19.super_unique_lock._8_8_ - (long)criticalblock19.super_unique_lock._M_device;
  b_05._M_ptr = (pointer)criticalblock19.super_unique_lock._M_device;
  pCVar7 = CScript::operator<<((CScript *)&hash,b_05);
  ppVar8 = &CScript::push_int64(pCVar7,100)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hash);
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_2e0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0._M_allocated_capacity = local_2e0._M_allocated_capacity & 0xffffffffffffff00;
  local_2d0._M_p = (pointer)local_2c0;
  local_2c8 = 0;
  local_2c0[0]._M_local_buf[0] = false;
  memset((PrecomputedTransactionData *)&hash,0,0x102);
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._3_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._5_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._6_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._7_1_ = '\0';
  local_6a0[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = '\0';
  local_6a0._17_8_ = 0;
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = (iterator)pVVar15;
  file_08.m_end = (iterator)0x11f;
  file_08.m_begin = (iterator)&local_9d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_9e0,
             msg_08);
  CTransaction::CTransaction((CTransaction *)&ptd_spend_tx,&invalid_with_cltv_tx);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  bVar6 = CheckInputScripts((CTransaction *)&ptd_spend_tx,(TxValidationState *)&vchSig,pCVar10,0x200
                            ,true,true,(PrecomputedTransactionData *)&hash,pVVar15,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash_2.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_a70;
  local_a70._0_8_ =
       "CheckInputScripts(CTransaction(invalid_with_cltv_tx), state, m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr)"
  ;
  local_a70.m_message.px = (element_type *)0xc66dbd;
  hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash_2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash_2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_a00 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vchSig_2,(lazy_ostream *)&hash_2,1,0,WARN,(check_type)pVVar15,
             (size_t)&local_a08,0x11f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CTransaction::~CTransaction((CTransaction *)&ptd_spend_tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_6a0);
  ValidationState<TxValidationResult>::~ValidationState
            ((ValidationState<TxValidationResult> *)&vchSig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock19);
  CMutableTransaction::~CMutableTransaction(&invalid_with_cltv_tx);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&scriptchecks);
  local_398 = 2;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&scriptchecks,1);
  CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
  *(undefined8 *)
   ((long)&((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union + 8)
       = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   ((long)&((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union +
   0x10) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  ((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start)->m_tx_out).nValue =
       hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  ((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union.
  indirect_contents.indirect = (char *)hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined4 *)
   ((long)&((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union +
   0x18) = 3;
  *(undefined4 *)
   &(scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
     super__Vector_impl_data._M_start)->m_signature_cache = 100;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_3b0,1);
  (local_3b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             ((long)local_3b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 8),&p2pk_scriptPubKey.super_CScriptBase);
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar17 = &hash;
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  _cVar19 = CHECK_PRED;
  pvVar14 = &DAT_00000001;
  SignatureHash<CMutableTransaction>
            (&hash_2,&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start[3].scriptPubKey,
             (CMutableTransaction *)&scriptchecks,0,1,(CAmount *)puVar17,BASE,
             (PrecomputedTransactionData *)0x0);
  local_a18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_a10 = "";
  local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)puVar17;
  msg_09.m_begin = pvVar14;
  file_09.m_end = (iterator)0x131;
  file_09.m_begin = (iterator)&local_a18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_a28,
             msg_09);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] =
       CKey::Sign(this_00,&hash_2,&vchSig_2,true,0);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_13604ee;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_13604ee + 0x1e);
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_a38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_a30 = "";
  pvVar14 = (iterator)0x0;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (ValidationState<TxValidationResult> *)&vchSig
  ;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar19,
             (size_t)&local_a38,0x131);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vchSig_2,(uchar *)&hash);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  b_06._M_extent._M_extent_value =
       (long)vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_06._M_ptr = vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pCVar7 = CScript::operator<<((CScript *)&hash,b_06);
  ppVar8 = &CScript::push_int64(pCVar7,0x65)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &(scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
               super__Vector_impl_data._M_start)->ptxTo,ppVar8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hash);
  CTransaction::CTransaction((CTransaction *)&hash,(CMutableTransaction *)&scriptchecks);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  ValidateCheckInputsForAllFlags((CTransaction *)&hash,0x400,true,pCVar10,pVVar15);
  CTransaction::~CTransaction((CTransaction *)&hash);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  b_07._M_extent._M_extent_value =
       (long)vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_07._M_ptr = vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pCVar7 = CScript::operator<<((CScript *)&hash,b_07);
  ppVar8 = &CScript::push_int64(pCVar7,100)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             &(scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
               super__Vector_impl_data._M_start)->ptxTo,ppVar8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&hash);
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_3d8;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)invalid_with_cltv_tx.vout.
                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  invalid_with_cltv_tx.version = 0;
  invalid_with_cltv_tx.nLockTime = 0;
  local_3d8._M_local_buf[0] = '\0';
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&invalid_with_cltv_tx.vout;
  memset(&ptd_spend_tx,0,0x102);
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  ptd_spend_tx._281_8_ = 0;
  local_a48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_a40 = "";
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar14;
  msg_10.m_begin = (iterator)pVVar15;
  file_10.m_end = (iterator)0x13b;
  file_10.m_begin = (iterator)&local_a48;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_a58,
             msg_10);
  CTransaction::CTransaction((CTransaction *)&vchSig,(CMutableTransaction *)&scriptchecks);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar10,false);
  validation_cache =
       &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
         super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  bVar6 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&invalid_with_cltv_tx,
                            (CCoinsViewCache *)&hash,0x400,true,true,&ptd_spend_tx,validation_cache,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  local_a70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar6;
  local_a70.m_message.px = (element_type *)0x0;
  local_a70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_7c0 = &local_a80;
  local_a80 = 
  "CheckInputScripts(CTransaction(invalid_with_csv_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr)"
  ;
  local_a78 = "";
  criticalblock19.super_unique_lock._8_8_ =
       criticalblock19.super_unique_lock._8_8_ & 0xffffffffffffff00;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_7c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_a88 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a70,(lazy_ostream *)&criticalblock19,1,0,WARN,(check_type)validation_cache,
             (size_t)&local_a90,0x13b);
  boost::detail::shared_count::~shared_count(&local_a70.m_message.pn);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&hash);
  CTransaction::~CTransaction((CTransaction *)&vchSig);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ptd_spend_tx.m_spent_outputs);
  ValidationState<TxValidationResult>::~ValidationState
            ((ValidationState<TxValidationResult> *)&invalid_with_cltv_tx);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&scriptchecks);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&vchSig);
  local_2c8 = CONCAT44(local_2c8._4_4_,1);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig,1);
  CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
  *(undefined8 *)
   (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x10) = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x18) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 8) = hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\x01';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0,1);
  *(undefined8 *)local_2e0._M_allocated_capacity = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (local_2e0._M_allocated_capacity + 8),&p2pk_scriptPubKey.super_CScriptBase);
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffffffff0000;
  local_6e0._M_color = _S_red;
  local_6e0._M_parent = (_Base_ptr)0x0;
  memset(hash.super_base_blob<256U>.m_data._M_elems + 8,0,0xb8);
  local_6c0 = (ListNode *)0x0;
  local_6a0[3].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = '\0';
  local_640._16_8_ = local_640;
  local_640._0_4_ = _S_red;
  local_640._8_8_ = (_Base_ptr)0x0;
  local_640._32_8_ = (ListNode *)0x0;
  local_600 = (_Base_ptr)(local_640 + 0x30);
  local_640._48_4_ = _S_red;
  local_608 = (_Base_ptr)0x0;
  local_5c8._M_left = &local_5c8;
  local_5c8._M_color = _S_red;
  local_5c8._M_parent = (_Base_ptr)0x0;
  local_5f0 = (__node_base_ptr)0x0;
  pLStack_5e8 = (ListNode *)0x0;
  local_5e0 = (ListNode *)0x0;
  pLStack_5d8 = (ListNode *)0x0;
  local_5a8 = (ListNode *)0x0;
  local_598._M_left = &local_598;
  local_598._M_color = _S_red;
  local_598._M_parent = (_Base_ptr)0x0;
  local_578 = 0;
  local_568._M_left = &local_568;
  local_568._M_color = _S_red;
  local_568._M_parent = (_Base_ptr)0x0;
  local_4d0._M_left = &local_4d0;
  local_4d0._M_color = _S_red;
  local_4d0._M_parent = (_Base_ptr)0x0;
  auStack_510[0x28] = '\0';
  auStack_510[0x29] = '\0';
  auStack_510[0x2a] = '\0';
  auStack_510[0x2b] = '\0';
  auStack_510[0x2c] = '\0';
  auStack_510[0x2d] = '\0';
  auStack_510[0x2e] = '\0';
  auStack_510[0x2f] = '\0';
  auStack_510[0x30] = '\0';
  auStack_510[0x31] = '\0';
  auStack_510[0x32] = '\0';
  auStack_510[0x33] = '\0';
  auStack_510[0x18] = '\0';
  auStack_510[0x19] = '\0';
  auStack_510[0x1a] = '\0';
  auStack_510[0x1b] = '\0';
  auStack_510[0x1c] = '\0';
  auStack_510[0x1d] = '\0';
  auStack_510[0x1e] = '\0';
  auStack_510[0x1f] = '\0';
  auStack_510[0x20] = '\0';
  auStack_510[0x21] = '\0';
  auStack_510[0x22] = '\0';
  auStack_510[0x23] = '\0';
  auStack_510[0x24] = '\0';
  auStack_510[0x25] = '\0';
  auStack_510[0x26] = '\0';
  auStack_510[0x27] = '\0';
  auStack_510[8] = '\0';
  auStack_510[9] = '\0';
  auStack_510[10] = '\0';
  auStack_510[0xb] = '\0';
  auStack_510[0xc] = '\0';
  auStack_510[0xd] = '\0';
  auStack_510[0xe] = '\0';
  auStack_510[0xf] = '\0';
  auStack_510[0x10] = '\0';
  auStack_510[0x11] = '\0';
  auStack_510[0x12] = '\0';
  auStack_510[0x13] = '\0';
  auStack_510[0x14] = '\0';
  auStack_510[0x15] = '\0';
  auStack_510[0x16] = '\0';
  auStack_510[0x17] = '\0';
  local_518 = (pointer)0x0;
  auStack_510[0] = '\0';
  auStack_510[1] = '\0';
  auStack_510[2] = '\0';
  auStack_510[3] = '\0';
  auStack_510[4] = '\0';
  auStack_510[5] = '\0';
  auStack_510[6] = '\0';
  auStack_510[7] = '\0';
  local_528 = (pointer)0x0;
  pCStack_520 = (pointer)0x0;
  local_538 = (pointer)0x0;
  pCStack_530 = (pointer)0x0;
  local_548 = 0;
  pCStack_540 = (pointer)0x0;
  local_4b0 = 0;
  local_4a0._M_left = &local_4a0;
  local_4a0._M_color = _S_red;
  local_4a0._M_parent = (_Base_ptr)0x0;
  local_480 = 0;
  local_470._M_left = &local_470;
  local_470._M_color = _S_red;
  local_470._M_parent = (_Base_ptr)0x0;
  local_450 = 0;
  local_440._M_left = &local_440;
  local_440._M_color = _S_red;
  local_440._M_parent = (_Base_ptr)0x0;
  local_420 = 0;
  local_aa0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar16;
  msg_11.m_begin = pvVar14;
  file_11.m_end = (iterator)0x14e;
  file_11.m_begin = (iterator)&local_aa0;
  local_6e0._M_left = &local_6e0;
  local_6e0._M_right = &local_6e0;
  local_640._24_8_ = local_640._16_8_;
  local_5f8 = local_600;
  local_5c8._M_right = local_5c8._M_left;
  local_598._M_right = local_598._M_left;
  local_568._M_right = local_568._M_left;
  local_4d0._M_right = local_4d0._M_left;
  local_4a0._M_right = local_4a0._M_left;
  local_470._M_right = local_470._M_left;
  local_440._M_right = local_440._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_ab0,
             msg_11);
  criticalblock19.super_unique_lock._M_device = (mutex_type *)0xa7d8c0;
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            ((MutableTransactionSignatureCreator *)&ptd_spend_tx,(CMutableTransaction *)&vchSig,0,
             (CAmount *)&criticalblock19,1);
  bVar6 = ProduceSignature(&keystore.super_SigningProvider,(BaseSignatureCreator *)&ptd_spend_tx,
                           &spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].scriptPubKey,
                           (SignatureData *)&hash);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(scriptchecks.
                         super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar6);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash_2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1360685;
  hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       (long)
       "ProduceSignature(keystore, MutableTransactionSignatureCreator(valid_with_witness_tx, 0, 11 * CENT, SIGHASH_ALL), spend_tx.vout[1].scriptPubKey, sigdata)"
       + 0x98;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&hash_2;
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_ab8 = "";
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&scriptchecks,(lazy_ostream *)&invalid_with_cltv_tx,1,0,WARN,
             (check_type)validation_cache,(size_t)&local_ac0,0x14e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  UpdateInput((CTxIn *)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,(SignatureData *)&hash);
  CTransaction::CTransaction((CTransaction *)&ptd_spend_tx,(CMutableTransaction *)&vchSig);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  ValidateCheckInputsForAllFlags
            ((CTransaction *)&ptd_spend_tx,0,true,pCVar10,
             &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache);
  CTransaction::~CTransaction((CTransaction *)&ptd_spend_tx);
  CScriptWitness::SetNull
            ((CScriptWitness *)
             (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x50));
  CTransaction::CTransaction((CTransaction *)&ptd_spend_tx,(CMutableTransaction *)&vchSig);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  ValidateCheckInputsForAllFlags((CTransaction *)&ptd_spend_tx,0x800,true,pCVar10,pVVar15);
  CTransaction::~CTransaction((CTransaction *)&ptd_spend_tx);
  SignatureData::~SignatureData((SignatureData *)&hash);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&vchSig);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)&scriptchecks);
  local_398 = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&scriptchecks,2);
  CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
  *(undefined8 *)
   ((long)&((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union + 8)
       = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   ((long)&((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union +
   0x10) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  ((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start)->m_tx_out).nValue =
       hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  ((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union.
  indirect_contents.indirect = (char *)hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined4 *)
   ((long)&((scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start)->m_tx_out).scriptPubKey.super_CScriptBase._union +
   0x18) = 0;
  CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start[1].ptxTo =
       (CTransaction *)hash.super_base_blob<256U>.m_data._M_elems._16_8_;
  *(undefined8 *)
   &scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start[1].nIn = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
  *(undefined8 *)
   ((long)&scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_tx_out.scriptPubKey.super_CScriptBase._union + 0x10
   ) = hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  *(undefined8 *)
   ((long)&scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_tx_out.scriptPubKey.super_CScriptBase._union + 0x18
   ) = hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  *(undefined4 *)
   &scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start[1].cacheStore = 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_3b0,1);
  (local_3b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 22000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             ((long)local_3b0.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start + 8),&p2pk_scriptPubKey.super_CScriptBase);
  lVar12 = 0;
  local_b84 = 0;
  for (lVar13 = 8; lVar13 != 0x58; lVar13 = lVar13 + 0x28) {
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         hash.super_base_blob<256U>.m_data._M_elems._0_8_ & 0xffffffffffff0000;
    local_6e0._M_color = _S_red;
    local_6e0._M_parent = (_Base_ptr)0x0;
    memset(hash.super_base_blob<256U>.m_data._M_elems + 8,0,0xb8);
    local_6e0._M_left = &local_6e0;
    local_6c0 = (ListNode *)0x0;
    local_6a0[3].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._0_1_ = '\0';
    local_640._0_4_ = _S_red;
    local_640._8_8_ = (_Base_ptr)0x0;
    local_640._16_8_ = local_640;
    local_640._32_8_ = (ListNode *)0x0;
    local_640._48_4_ = _S_red;
    local_608 = (_Base_ptr)0x0;
    local_600 = (_Base_ptr)(local_640 + 0x30);
    local_5c8._M_color = _S_red;
    local_5c8._M_parent = (_Base_ptr)0x0;
    local_5f0 = (__node_base_ptr)0x0;
    pLStack_5e8 = (ListNode *)0x0;
    local_5e0 = (ListNode *)0x0;
    pLStack_5d8 = (ListNode *)0x0;
    local_5c8._M_left = &local_5c8;
    local_5a8 = (ListNode *)0x0;
    local_598._M_color = _S_red;
    local_598._M_parent = (_Base_ptr)0x0;
    local_598._M_left = &local_598;
    local_578 = 0;
    local_568._M_color = _S_red;
    local_568._M_parent = (_Base_ptr)0x0;
    local_568._M_left = &local_568;
    local_4d0._M_color = _S_red;
    local_4d0._M_parent = (_Base_ptr)0x0;
    local_548 = 0;
    pCStack_540 = (pointer)0x0;
    local_538 = (pointer)0x0;
    pCStack_530 = (pointer)0x0;
    local_528 = (pointer)0x0;
    pCStack_520 = (pointer)0x0;
    local_518 = (pointer)0x0;
    auStack_510[0] = '\0';
    auStack_510[1] = '\0';
    auStack_510[2] = '\0';
    auStack_510[3] = '\0';
    auStack_510[4] = '\0';
    auStack_510[5] = '\0';
    auStack_510[6] = '\0';
    auStack_510[7] = '\0';
    auStack_510[8] = '\0';
    auStack_510[9] = '\0';
    auStack_510[10] = '\0';
    auStack_510[0xb] = '\0';
    auStack_510[0xc] = '\0';
    auStack_510[0xd] = '\0';
    auStack_510[0xe] = '\0';
    auStack_510[0xf] = '\0';
    auStack_510[0x10] = '\0';
    auStack_510[0x11] = '\0';
    auStack_510[0x12] = '\0';
    auStack_510[0x13] = '\0';
    auStack_510[0x14] = '\0';
    auStack_510[0x15] = '\0';
    auStack_510[0x16] = '\0';
    auStack_510[0x17] = '\0';
    auStack_510[0x18] = '\0';
    auStack_510[0x19] = '\0';
    auStack_510[0x1a] = '\0';
    auStack_510[0x1b] = '\0';
    auStack_510[0x1c] = '\0';
    auStack_510[0x1d] = '\0';
    auStack_510[0x1e] = '\0';
    auStack_510[0x1f] = '\0';
    auStack_510[0x20] = '\0';
    auStack_510[0x21] = '\0';
    auStack_510[0x22] = '\0';
    auStack_510[0x23] = '\0';
    auStack_510[0x24] = '\0';
    auStack_510[0x25] = '\0';
    auStack_510[0x26] = '\0';
    auStack_510[0x27] = '\0';
    auStack_510[0x28] = '\0';
    auStack_510[0x29] = '\0';
    auStack_510[0x2a] = '\0';
    auStack_510[0x2b] = '\0';
    auStack_510[0x2c] = '\0';
    auStack_510[0x2d] = '\0';
    auStack_510[0x2e] = '\0';
    auStack_510[0x2f] = '\0';
    auStack_510[0x30] = '\0';
    auStack_510[0x31] = '\0';
    auStack_510[0x32] = '\0';
    auStack_510[0x33] = '\0';
    local_4d0._M_left = &local_4d0;
    local_4b0 = 0;
    local_4a0._M_color = _S_red;
    local_4a0._M_parent = (_Base_ptr)0x0;
    local_4a0._M_left = &local_4a0;
    local_480 = 0;
    local_470._M_color = _S_red;
    local_470._M_parent = (_Base_ptr)0x0;
    local_470._M_left = &local_470;
    local_450 = 0;
    local_440._M_color = _S_red;
    local_440._M_parent = (_Base_ptr)0x0;
    local_440._M_left = &local_440;
    local_420 = 0;
    local_ad0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_ac8 = "";
    local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = pvVar14;
    msg_12.m_begin = (iterator)pVVar15;
    file_12.m_end = (iterator)0x16a;
    file_12.m_begin = (iterator)&local_ad0;
    local_6e0._M_right = local_6e0._M_left;
    local_640._24_8_ = local_640._16_8_;
    local_5f8 = local_600;
    local_5c8._M_right = local_5c8._M_left;
    local_598._M_right = local_598._M_left;
    local_568._M_right = local_568._M_left;
    local_4d0._M_right = local_4d0._M_left;
    local_4a0._M_right = local_4a0._M_left;
    local_470._M_right = local_470._M_left;
    local_440._M_right = local_440._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_ae0,
               msg_12);
    criticalblock19.super_unique_lock._M_device = (mutex_type *)0xa7d8c0;
    MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
              ((MutableTransactionSignatureCreator *)&ptd_spend_tx,
               (CMutableTransaction *)&scriptchecks,local_b84,(CAmount *)&criticalblock19,1);
    bVar6 = ProduceSignature(&keystore.super_SigningProvider,(BaseSignatureCreator *)&ptd_spend_tx,
                             (CScript *)
                             ((long)&(spend_tx.vout.
                                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                      super__Vector_impl_data._M_start)->nValue + lVar13),
                             (SignatureData *)&hash);
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(invalid_with_cltv_tx.vin.
                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar6);
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    hash_2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_136069f;
    hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)
         "ProduceSignature(keystore, MutableTransactionSignatureCreator(tx, i, 11 * CENT, SIGHASH_ALL), spend_tx.vout[i].scriptPubKey, sigdata)"
         + 0x85;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "<W\x1b";
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_2e0._M_allocated_capacity = (size_type)&hash_2;
    local_af0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_ae8 = "";
    pVVar15 = (ValidationCache *)&DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&invalid_with_cltv_tx,(lazy_ostream *)&vchSig,1,0,WARN,
               (check_type)validation_cache,(size_t)&local_af0,0x16a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    UpdateInput((CTxIn *)((long)&((scriptchecks.
                                   super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->m_tx_out).nValue +
                         lVar12),(SignatureData *)&hash);
    SignatureData::~SignatureData((SignatureData *)&hash);
    local_b84 = local_b84 + 1;
    lVar12 = lVar12 + 0x68;
  }
  CTransaction::CTransaction((CTransaction *)&hash,(CMutableTransaction *)&scriptchecks);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  ValidateCheckInputsForAllFlags((CTransaction *)&hash,0,true,pCVar10,pVVar15);
  CTransaction::~CTransaction((CTransaction *)&hash);
  CScriptWitness::SetNull
            ((CScriptWitness *)
             ((long)&scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                     _M_impl.super__Vector_impl_data._M_start[2].m_tx_out.scriptPubKey.
                     super_CScriptBase._union + 0x10));
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)invalid_with_cltv_tx.vout.
                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_3d8;
  invalid_with_cltv_tx.version = 0;
  invalid_with_cltv_tx.nLockTime = 0;
  local_3d8._M_local_buf[0] = '\0';
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&invalid_with_cltv_tx.vout;
  memset(&ptd_spend_tx,0,0x102);
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  ptd_spend_tx._281_8_ = 0;
  local_b00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_af8 = "";
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar14;
  msg_13.m_begin = (iterator)pVVar15;
  file_13.m_end = (iterator)0x179;
  file_13.m_begin = (iterator)&local_b00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_b10,
             msg_13);
  CTransaction::CTransaction((CTransaction *)&vchSig,(CMutableTransaction *)&scriptchecks);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar10,false);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  bVar6 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&invalid_with_cltv_tx,
                            (CCoinsViewCache *)&hash,0x801,true,true,&ptd_spend_tx,pVVar15,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  criticalblock19.super_unique_lock._M_device =
       (mutex_type *)CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,!bVar6);
  criticalblock19.super_unique_lock._M_owns = false;
  criticalblock19.super_unique_lock._9_7_ = 0;
  local_7c8.pi_ = (sp_counted_base *)0x0;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "!CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, nullptr)"
  ;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash_2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash_2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash_2.super_base_blob<256U>.m_data._M_elems._24_8_ = &vchSig_2;
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_b18 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&criticalblock19,(lazy_ostream *)&hash_2,1,0,WARN,
             (check_type)pVVar15,(size_t)&local_b20,0x179);
  boost::detail::shared_count::~shared_count(&local_7c8);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&hash);
  CTransaction::~CTransaction((CTransaction *)&vchSig);
  local_7c8.pi_ = (sp_counted_base *)0x0;
  criticalblock19.super_unique_lock._M_device = (mutex_type *)0x0;
  criticalblock19.super_unique_lock._M_owns = false;
  criticalblock19.super_unique_lock._9_7_ = 0;
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_b28 = "";
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar16;
  msg_14.m_begin = pvVar14;
  file_14.m_end = (iterator)0x17e;
  file_14.m_begin = (iterator)&local_b30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b40,
             msg_14);
  CTransaction::CTransaction((CTransaction *)&vchSig,(CMutableTransaction *)&scriptchecks);
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                      super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar10 = Chainstate::CoinsTip(pCVar9);
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar10,false);
  pVVar15 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
              super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
              super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t
              .super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
              super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache;
  bVar6 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&invalid_with_cltv_tx,
                            (CCoinsViewCache *)&hash,0x801,true,true,&ptd_spend_tx,pVVar15,
                            (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&criticalblock19)
  ;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a70._0_8_ =
       "CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, &scriptchecks)"
  ;
  local_a70.m_message.px = (element_type *)0xc67149;
  hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash_2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash_2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  hash_2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash_2.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_a70;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_b48 = "";
  pvVar14 = &DAT_00000001;
  pvVar16 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vchSig_2,(lazy_ostream *)&hash_2,1,0,WARN,(check_type)pVVar15,
             (size_t)&local_b50,0x17e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vchSig_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&hash);
  CTransaction::~CTransaction((CTransaction *)&vchSig);
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_b58 = "";
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar16;
  msg_15.m_begin = pvVar14;
  file_15.m_end = (iterator)0x180;
  file_15.m_begin = (iterator)&local_b60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b70,
             msg_15);
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_b78 = "";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((criticalblock19.super_unique_lock._8_8_ -
                 (long)criticalblock19.super_unique_lock._M_device) / 0x50);
  hash_2.super_base_blob<256U>.m_data._M_elems[0] = '\x02';
  hash_2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash_2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&hash,&local_b80,0x180,1,2,&vchSig,"scriptchecks.size()",(lazy_ostream *)&hash_2,"2U");
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
            ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&criticalblock19);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ptd_spend_tx.m_spent_outputs);
  ValidationState<TxValidationResult>::~ValidationState
            ((ValidationState<TxValidationResult> *)&invalid_with_cltv_tx);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)&scriptchecks);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock20.super_unique_lock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  CMutableTransaction::~CMutableTransaction(&spend_tx);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&p2wpkh_scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&p2pkh_scriptPubKey.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2sh_scriptPubKey.super_CScriptBase)
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2pk_scriptPubKey.super_CScriptBase)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(checkinputs_test, Dersig100Setup)
{
    // Test that passing CheckInputScripts with one set of script flags doesn't imply
    // that we would pass again with a different set of flags.
    CScript p2pk_scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    CScript p2sh_scriptPubKey = GetScriptForDestination(ScriptHash(p2pk_scriptPubKey));
    CScript p2pkh_scriptPubKey = GetScriptForDestination(PKHash(coinbaseKey.GetPubKey()));
    CScript p2wpkh_scriptPubKey = GetScriptForDestination(WitnessV0KeyHash(coinbaseKey.GetPubKey()));

    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKey(coinbaseKey));
    BOOST_CHECK(keystore.AddCScript(p2pk_scriptPubKey));

    // flags to test: SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, SCRIPT_VERIFY_CHECKSEQUENCE_VERIFY, SCRIPT_VERIFY_NULLDUMMY, uncompressed pubkey thing

    // Create 2 outputs that match the three scripts above, spending the first
    // coinbase tx.
    CMutableTransaction spend_tx;

    spend_tx.version = 1;
    spend_tx.vin.resize(1);
    spend_tx.vin[0].prevout.hash = m_coinbase_txns[0]->GetHash();
    spend_tx.vin[0].prevout.n = 0;
    spend_tx.vout.resize(4);
    spend_tx.vout[0].nValue = 11*CENT;
    spend_tx.vout[0].scriptPubKey = p2sh_scriptPubKey;
    spend_tx.vout[1].nValue = 11*CENT;
    spend_tx.vout[1].scriptPubKey = p2wpkh_scriptPubKey;
    spend_tx.vout[2].nValue = 11*CENT;
    spend_tx.vout[2].scriptPubKey = CScript() << OP_CHECKLOCKTIMEVERIFY << OP_DROP << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    spend_tx.vout[3].nValue = 11*CENT;
    spend_tx.vout[3].scriptPubKey = CScript() << OP_CHECKSEQUENCEVERIFY << OP_DROP << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;

    // Sign, with a non-DER signature
    {
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(p2pk_scriptPubKey, spend_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char) 0); // padding byte makes this non-DER
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        spend_tx.vin[0].scriptSig << vchSig;
    }

    // Test that invalidity under a set of flags doesn't preclude validity
    // under other (eg consensus) flags.
    // spend_tx is invalid according to DERSIG
    {
        LOCK(cs_main);

        TxValidationState state;
        PrecomputedTransactionData ptd_spend_tx;

        BOOST_CHECK(!CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, nullptr));

        // If we call again asking for scriptchecks (as happens in
        // ConnectBlock), we should add a script check object for this -- we're
        // not caching invalidity (if that changes, delete this test case).
        std::vector<CScriptCheck> scriptchecks;
        BOOST_CHECK(CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, &scriptchecks));
        BOOST_CHECK_EQUAL(scriptchecks.size(), 1U);

        // Test that CheckInputScripts returns true iff DERSIG-enforcing flags are
        // not present.  Don't add these checks to the cache, so that we can
        // test later that block validation works fine in the absence of cached
        // successes.
        ValidateCheckInputsForAllFlags(CTransaction(spend_tx), SCRIPT_VERIFY_DERSIG | SCRIPT_VERIFY_LOW_S | SCRIPT_VERIFY_STRICTENC, false, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    // And if we produce a block with this tx, it should be valid (DERSIG not
    // enabled yet), even though there's no cache entry.
    CBlock block;

    block = CreateAndProcessBlock({spend_tx}, p2pk_scriptPubKey);
    LOCK(cs_main);
    BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash());
    BOOST_CHECK(m_node.chainman->ActiveChainstate().CoinsTip().GetBestBlock() == block.GetHash());

    // Test P2SH: construct a transaction that is valid without P2SH, and
    // then test validity with P2SH.
    {
        CMutableTransaction invalid_under_p2sh_tx;
        invalid_under_p2sh_tx.version = 1;
        invalid_under_p2sh_tx.vin.resize(1);
        invalid_under_p2sh_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_under_p2sh_tx.vin[0].prevout.n = 0;
        invalid_under_p2sh_tx.vout.resize(1);
        invalid_under_p2sh_tx.vout[0].nValue = 11*CENT;
        invalid_under_p2sh_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;
        std::vector<unsigned char> vchSig2(p2pk_scriptPubKey.begin(), p2pk_scriptPubKey.end());
        invalid_under_p2sh_tx.vin[0].scriptSig << vchSig2;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_under_p2sh_tx), SCRIPT_VERIFY_P2SH, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    // Test CHECKLOCKTIMEVERIFY
    {
        CMutableTransaction invalid_with_cltv_tx;
        invalid_with_cltv_tx.version = 1;
        invalid_with_cltv_tx.nLockTime = 100;
        invalid_with_cltv_tx.vin.resize(1);
        invalid_with_cltv_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_with_cltv_tx.vin[0].prevout.n = 2;
        invalid_with_cltv_tx.vin[0].nSequence = 0;
        invalid_with_cltv_tx.vout.resize(1);
        invalid_with_cltv_tx.vout[0].nValue = 11*CENT;
        invalid_with_cltv_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(spend_tx.vout[2].scriptPubKey, invalid_with_cltv_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        invalid_with_cltv_tx.vin[0].scriptSig = CScript() << vchSig << 101;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_with_cltv_tx), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Make it valid, and check again
        invalid_with_cltv_tx.vin[0].scriptSig = CScript() << vchSig << 100;
        TxValidationState state;
        PrecomputedTransactionData txdata;
        BOOST_CHECK(CheckInputScripts(CTransaction(invalid_with_cltv_tx), state, m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));
    }

    // TEST CHECKSEQUENCEVERIFY
    {
        CMutableTransaction invalid_with_csv_tx;
        invalid_with_csv_tx.version = 2;
        invalid_with_csv_tx.vin.resize(1);
        invalid_with_csv_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_with_csv_tx.vin[0].prevout.n = 3;
        invalid_with_csv_tx.vin[0].nSequence = 100;
        invalid_with_csv_tx.vout.resize(1);
        invalid_with_csv_tx.vout[0].nValue = 11*CENT;
        invalid_with_csv_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(spend_tx.vout[3].scriptPubKey, invalid_with_csv_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        invalid_with_csv_tx.vin[0].scriptSig = CScript() << vchSig << 101;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_with_csv_tx), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Make it valid, and check again
        invalid_with_csv_tx.vin[0].scriptSig = CScript() << vchSig << 100;
        TxValidationState state;
        PrecomputedTransactionData txdata;
        BOOST_CHECK(CheckInputScripts(CTransaction(invalid_with_csv_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));
    }

    // TODO: add tests for remaining script flags

    // Test that passing CheckInputScripts with a valid witness doesn't imply success
    // for the same tx with a different witness.
    {
        CMutableTransaction valid_with_witness_tx;
        valid_with_witness_tx.version = 1;
        valid_with_witness_tx.vin.resize(1);
        valid_with_witness_tx.vin[0].prevout.hash = spend_tx.GetHash();
        valid_with_witness_tx.vin[0].prevout.n = 1;
        valid_with_witness_tx.vout.resize(1);
        valid_with_witness_tx.vout[0].nValue = 11*CENT;
        valid_with_witness_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        SignatureData sigdata;
        BOOST_CHECK(ProduceSignature(keystore, MutableTransactionSignatureCreator(valid_with_witness_tx, 0, 11 * CENT, SIGHASH_ALL), spend_tx.vout[1].scriptPubKey, sigdata));
        UpdateInput(valid_with_witness_tx.vin[0], sigdata);

        // This should be valid under all script flags.
        ValidateCheckInputsForAllFlags(CTransaction(valid_with_witness_tx), 0, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Remove the witness, and check that it is now invalid.
        valid_with_witness_tx.vin[0].scriptWitness.SetNull();
        ValidateCheckInputsForAllFlags(CTransaction(valid_with_witness_tx), SCRIPT_VERIFY_WITNESS, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    {
        // Test a transaction with multiple inputs.
        CMutableTransaction tx;

        tx.version = 1;
        tx.vin.resize(2);
        tx.vin[0].prevout.hash = spend_tx.GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vin[1].prevout.hash = spend_tx.GetHash();
        tx.vin[1].prevout.n = 1;
        tx.vout.resize(1);
        tx.vout[0].nValue = 22*CENT;
        tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        for (int i = 0; i < 2; ++i) {
            SignatureData sigdata;
            BOOST_CHECK(ProduceSignature(keystore, MutableTransactionSignatureCreator(tx, i, 11 * CENT, SIGHASH_ALL), spend_tx.vout[i].scriptPubKey, sigdata));
            UpdateInput(tx.vin[i], sigdata);
        }

        // This should be valid under all script flags
        ValidateCheckInputsForAllFlags(CTransaction(tx), 0, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Check that if the second input is invalid, but the first input is
        // valid, the transaction is not cached.
        // Invalidate vin[1]
        tx.vin[1].scriptWitness.SetNull();

        TxValidationState state;
        PrecomputedTransactionData txdata;
        // This transaction is now invalid under segwit, because of the second input.
        BOOST_CHECK(!CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));

        std::vector<CScriptCheck> scriptchecks;
        // Make sure this transaction was not cached (ie because the first
        // input was valid)
        BOOST_CHECK(CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, &scriptchecks));
        // Should get 2 script checks back -- caching is on a whole-transaction basis.
        BOOST_CHECK_EQUAL(scriptchecks.size(), 2U);
    }
}